

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O1

void tcu::anon_unknown_0::decompressEAC_RG11(PixelBufferAccess *dst,deUint8 *src,bool signedMode)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  ulong src_00;
  int i;
  long lVar4;
  ushort *puVar5;
  long lVar6;
  ushort *puVar7;
  ushort uVar8;
  ulong src_01;
  deUint8 *dst_00;
  deUint8 *dst_01;
  deUint8 uncompressedBlockG [32];
  deUint8 uncompressedBlockR [32];
  deUint8 local_78 [32];
  deUint8 local_58 [40];
  
  pvVar2 = (dst->super_ConstPixelBufferAccess).m_data;
  iVar1 = (dst->super_ConstPixelBufferAccess).m_pitch.m_data[1];
  lVar4 = 0;
  src_00 = 0;
  do {
    src_00 = (ulong)src[lVar4] | src_00 << 8;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  lVar4 = 0;
  src_01 = 0;
  do {
    src_01 = (ulong)src[lVar4 + 8] | src_01 << 8;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  dst_00 = local_58;
  EtcDecompressInternal::decompressEAC11Block(dst_00,src_00,signedMode);
  dst_01 = local_78;
  EtcDecompressInternal::decompressEAC11Block(dst_01,src_01,signedMode);
  iVar3 = 0;
  lVar4 = 0;
  do {
    puVar5 = (ushort *)((long)iVar3 + (long)pvVar2);
    lVar6 = 0;
    do {
      if (signedMode) {
        uVar8 = *(ushort *)(dst_00 + lVar6 * 2);
        if ((short)uVar8 < 0) {
          uVar8 = -((ushort)((-(uint)uVar8 & 0xffff) >> 6) | uVar8 * -0x20);
        }
        else {
          uVar8 = uVar8 >> 6 | uVar8 << 5;
        }
        puVar7 = (ushort *)((long)pvVar2 + lVar6 * 4 + (long)(iVar1 * (int)lVar4));
        *puVar5 = uVar8;
        uVar8 = *(ushort *)(dst_01 + lVar6 * 2);
        if ((short)uVar8 < 0) {
          uVar8 = -((ushort)((-(uint)uVar8 & 0xffff) >> 6) | uVar8 * -0x20);
        }
        else {
          uVar8 = uVar8 >> 6 | uVar8 << 5;
        }
      }
      else {
        *puVar5 = *(ushort *)(dst_00 + lVar6 * 2) >> 6 | *(ushort *)(dst_00 + lVar6 * 2) << 5;
        uVar8 = *(ushort *)(dst_01 + lVar6 * 2) >> 6 | *(ushort *)(dst_01 + lVar6 * 2) << 5;
        puVar7 = puVar5;
      }
      puVar7[1] = uVar8;
      lVar6 = lVar6 + 1;
      puVar5 = puVar5 + 2;
    } while (lVar6 != 4);
    lVar4 = lVar4 + 1;
    dst_01 = dst_01 + 8;
    dst_00 = dst_00 + 8;
    iVar3 = iVar3 + iVar1;
  } while (lVar4 != 4);
  return;
}

Assistant:

void decompressEAC_RG11 (const PixelBufferAccess& dst, const deUint8* src, bool signedMode)
{
	using namespace EtcDecompressInternal;

	deUint8* const	dstPtr			= (deUint8*)dst.getDataPtr();
	const int		dstRowPitch		= dst.getRowPitch();
	const int		dstPixelSize	= ETC2_UNCOMPRESSED_PIXEL_SIZE_RG11;

	const deUint64	compressedBlockR = get128BitBlockStart(src, 0);
	const deUint64	compressedBlockG = get128BitBlockEnd(src, 0);
	deUint8			uncompressedBlockR[ETC2_UNCOMPRESSED_BLOCK_SIZE_R11];
	deUint8			uncompressedBlockG[ETC2_UNCOMPRESSED_BLOCK_SIZE_R11];

	// Decompress.
	decompressEAC11Block(uncompressedBlockR, compressedBlockR, signedMode);
	decompressEAC11Block(uncompressedBlockG, compressedBlockG, signedMode);

	// Write to dst.
	for (int y = 0; y < (int)ETC2_BLOCK_HEIGHT; y++)
	{
		for (int x = 0; x < (int)ETC2_BLOCK_WIDTH; x++)
		{
			DE_STATIC_ASSERT(ETC2_UNCOMPRESSED_PIXEL_SIZE_RG11 == 4);

			if (signedMode)
			{
				const deInt16* const	srcPixelR	= (deInt16*)&uncompressedBlockR[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				const deInt16* const	srcPixelG	= (deInt16*)&uncompressedBlockG[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				deInt16* const			dstPixel	= (deInt16*)(dstPtr + y*dstRowPitch + x*dstPixelSize);

				dstPixel[0] = extend11To16WithSign(srcPixelR[0]);
				dstPixel[1] = extend11To16WithSign(srcPixelG[0]);
			}
			else
			{
				const deUint16* const	srcPixelR	= (deUint16*)&uncompressedBlockR[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				const deUint16* const	srcPixelG	= (deUint16*)&uncompressedBlockG[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				deUint16* const			dstPixel	= (deUint16*)(dstPtr + y*dstRowPitch + x*dstPixelSize);

				dstPixel[0] = extend11To16(srcPixelR[0]);
				dstPixel[1] = extend11To16(srcPixelG[0]);
			}
		}
	}
}